

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::Array<wchar_t>_> *
kj::encodeWideString
          (EncodingResult<kj::Array<wchar_t>_> *__return_storage_ptr__,ArrayPtr<const_char> text,
          bool nulTerminate)

{
  bool in_R8B;
  ArrayPtr<const_char> text_00;
  EncodingResult<kj::Array<char32_t>_> local_48;
  undefined1 local_21;
  WideConverter<4UL> *pWStack_20;
  bool nulTerminate_local;
  ArrayPtr<const_char> text_local;
  EncodingResult<kj::Array<char32_t>_> *result;
  
  text_00.ptr = (char *)text.size_;
  pWStack_20 = (WideConverter<4UL> *)text.ptr;
  text_00.size_._0_4_ = nulTerminate & 1;
  text_00.size_._4_4_ = 0;
  local_21 = nulTerminate;
  text_local.ptr = text_00.ptr;
  text_local.size_ = (size_t)__return_storage_ptr__;
  anon_unknown_0::WideConverter<4UL>::encode(&local_48,pWStack_20,text_00,in_R8B);
  (anonymous_namespace)::coerceTo<wchar_t,char32_t>
            (__return_storage_ptr__,(_anonymous_namespace_ *)&local_48,result);
  EncodingResult<kj::Array<char32_t>_>::~EncodingResult(&local_48);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<Array<wchar_t>> encodeWideString(ArrayPtr<const char> text, bool nulTerminate) {
  return coerceTo<wchar_t>(WideConverter<sizeof(wchar_t)>::encode(text, nulTerminate));
}